

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O1

void __thiscall
google::protobuf::util::converter::DefaultValueObjectWriter::MaybePopulateChildrenOfAny
          (DefaultValueObjectWriter *this,Node *node)

{
  int iVar1;
  
  if (((node != (Node *)0x0) && (node->is_any_ == true)) && (node->type_ != (Type *)0x0)) {
    iVar1 = std::__cxx11::string::compare((char *)(node->type_->name_).ptr_);
    if ((iVar1 != 0) &&
       (((long)(node->children_).
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(node->children_).
               super__Vector_base<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*,_std::allocator<google::protobuf::util::converter::DefaultValueObjectWriter::Node_*>_>
               ._M_impl.super__Vector_impl_data._M_start & 0x7fffffff8U) == 8)) {
      (*node->_vptr_Node[2])(node,this->typeinfo_);
      return;
    }
  }
  return;
}

Assistant:

void DefaultValueObjectWriter::MaybePopulateChildrenOfAny(Node* node) {
  // If this is an "Any" node with "@type" already given and no other children
  // have been added, populates its children.
  if (node != nullptr && node->is_any() && node->type() != nullptr &&
      node->type()->name() != kAnyType && node->number_of_children() == 1) {
    node->PopulateChildren(typeinfo_);
  }
}